

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O1

string * __thiscall
RigidBodyDynamics::Utils::get_dof_name_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,SpatialVector *joint_dof)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  undefined4 in_EAX;
  int iVar8;
  undefined4 uVar9;
  ostream *poVar10;
  char *pcVar11;
  char *pcVar12;
  ostringstream dof_stream;
  Utils *local_198;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  dVar7 = *(double *)this;
  auVar3._4_4_ = -(uint)(*(double *)(this + 8) != 0.0);
  auVar3._0_4_ = -(uint)(dVar7 != 1.0);
  auVar3._8_4_ = -(uint)(*(double *)(this + 0x10) != 0.0);
  auVar3._12_4_ = -(uint)(*(double *)(this + 0x18) != 0.0);
  iVar8 = movmskps(in_EAX,auVar3);
  if (iVar8 == 0) {
    if ((*(double *)(this + 0x20) != 0.0) || (NAN(*(double *)(this + 0x20)))) goto LAB_0010c0be;
    if ((*(double *)(this + 0x28) != 0.0) || (NAN(*(double *)(this + 0x28)))) goto LAB_0010c0be;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar12 = "RX";
    pcVar11 = "";
LAB_0010c26c:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar12,pcVar11);
  }
  else {
LAB_0010c0be:
    if ((dVar7 == 0.0) && (!NAN(dVar7))) {
      auVar4._4_4_ = -(uint)(*(double *)(this + 0x10) != 0.0);
      auVar4._0_4_ = -(uint)(*(double *)(this + 8) != 1.0);
      auVar4._8_4_ = -(uint)(*(double *)(this + 0x18) != 0.0);
      auVar4._12_4_ = -(uint)(*(double *)(this + 0x20) != 0.0);
      iVar8 = movmskps(iVar8,auVar4);
      if ((char)iVar8 == '\0') {
        if ((*(double *)(this + 0x28) == 0.0) && (!NAN(*(double *)(this + 0x28)))) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar12 = "RY";
          pcVar11 = "";
          goto LAB_0010c26c;
        }
      }
    }
    if ((dVar7 == 0.0) && (!NAN(dVar7))) {
      if ((*(double *)(this + 8) == 0.0) && (!NAN(*(double *)(this + 8)))) {
        auVar5._4_4_ = -(uint)(*(double *)(this + 0x18) != 0.0);
        auVar5._0_4_ = -(uint)(*(double *)(this + 0x10) != 1.0);
        auVar5._8_4_ = -(uint)(*(double *)(this + 0x20) != 0.0);
        auVar5._12_4_ = -(uint)(*(double *)(this + 0x28) != 0.0);
        iVar8 = movmskps(iVar8,auVar5);
        if ((char)iVar8 == '\0') {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar12 = "RZ";
          pcVar11 = "";
          goto LAB_0010c26c;
        }
      }
    }
    if ((dVar7 == 0.0) && (!NAN(dVar7))) {
      if ((*(double *)(this + 8) == 0.0) && (!NAN(*(double *)(this + 8)))) {
        auVar6._4_4_ = -(uint)(*(double *)(this + 0x18) != 1.0);
        auVar6._0_4_ = -(uint)(*(double *)(this + 0x10) != 0.0);
        auVar6._8_4_ = -(uint)(*(double *)(this + 0x20) != 0.0);
        auVar6._12_4_ = -(uint)(*(double *)(this + 0x28) != 0.0);
        iVar8 = movmskps(iVar8,auVar6);
        if ((char)iVar8 == '\0') {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar12 = "TX";
          pcVar11 = "";
          goto LAB_0010c26c;
        }
      }
    }
    if ((dVar7 == 0.0) && (!NAN(dVar7))) {
      if ((*(double *)(this + 8) == 0.0) && (!NAN(*(double *)(this + 8)))) {
        auVar2._4_4_ = -(uint)(*(double *)(this + 0x18) != 0.0);
        auVar2._0_4_ = -(uint)(*(double *)(this + 0x10) != 0.0);
        auVar2._8_4_ = -(uint)(*(double *)(this + 0x20) != 1.0);
        auVar2._12_4_ = -(uint)(*(double *)(this + 0x28) != 0.0);
        iVar8 = movmskps(iVar8,auVar2);
        if ((char)iVar8 == '\0') {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar12 = "TY";
          pcVar11 = "";
          goto LAB_0010c26c;
        }
      }
    }
    if ((((dVar7 == 0.0) && (!NAN(dVar7))) && (*(double *)(this + 8) == 0.0)) &&
       (!NAN(*(double *)(this + 8)))) {
      auVar1._4_4_ = -(uint)(*(double *)(this + 0x18) != 0.0);
      auVar1._0_4_ = -(uint)(*(double *)(this + 0x10) != 0.0);
      auVar1._8_4_ = -(uint)(*(double *)(this + 0x20) != 0.0);
      auVar1._12_4_ = -(uint)(*(double *)(this + 0x28) != 1.0);
      uVar9 = movmskps(iVar8,auVar1);
      if ((char)uVar9 == '\0') {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar12 = "TZ";
        pcVar11 = "";
        goto LAB_0010c26c;
      }
    }
    std::__cxx11::ostringstream::ostringstream(local_190,_S_out);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"custom (",8);
    local_198 = this;
    poVar10 = Eigen::operator<<((ostream *)local_190,
                                (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                 *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

string get_dof_name (const SpatialVector &joint_dof) {
	if (joint_dof == SpatialVector (1., 0., 0., 0., 0., 0.)) 
		return "RX";
	else if (joint_dof == SpatialVector (0., 1., 0., 0., 0., 0.))
		return "RY";
	else if (joint_dof == SpatialVector (0., 0., 1., 0., 0., 0.))
		return "RZ";
	else if (joint_dof == SpatialVector (0., 0., 0., 1., 0., 0.))
		return "TX";
	else if (joint_dof == SpatialVector (0., 0., 0., 0., 1., 0.))
		return "TY";
	else if (joint_dof == SpatialVector (0., 0., 0., 0., 0., 1.))
		return "TZ";

	ostringstream dof_stream(ostringstream::out);
	dof_stream << "custom (" << joint_dof.transpose() << ")";
	return dof_stream.str();
}